

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O0

void * value_data(value v)

{
  value v_local;
  void *local_8;
  
  local_8 = v;
  if (v == (value)0x0) {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void *value_data(value v)
{
	if (v == NULL)
	{
		return NULL;
	}

	/* Right now the memory layout is designed in a way that
	* the first byte of the value is the data itself, so returning
	* the value as (void *) has the same effect as accessing the data
	*/
	return v;
}